

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

LayoutDirection __thiscall QTextBlock::textDirection(QTextBlock *this)

{
  bool bVar1;
  char16_t high;
  char16_t low_00;
  int iVar2;
  QTextFragmentData *pQVar3;
  QChar *pQVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  ushort low;
  uint ucs4;
  QChar *end_1;
  QChar *p;
  QTextFragmentData *frag;
  int pos;
  LayoutDirection dir;
  QString buffer;
  FragmentIterator end;
  FragmentIterator it;
  QTextDocumentPrivate *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QTextBlock *in_stack_ffffffffffffff60;
  wchar32 local_84;
  QChar *local_78;
  LayoutDirection local_54;
  undefined1 local_38 [16];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  blockFormat(in_stack_ffffffffffffff60);
  local_54 = QTextFormat::layoutDirection((QTextFormat *)0x88d5e5);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x88d5f6);
  if ((local_54 == LayoutDirectionAuto) &&
     (local_54 = QTextOption::textDirection((QTextOption *)(*in_RDI + 0x1d0)),
     local_54 == LayoutDirectionAuto)) {
    QTextDocumentPrivate::buffer(in_stack_ffffffffffffff48);
    iVar2 = position((QTextBlock *)in_stack_ffffffffffffff48);
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocumentPrivate::find
              ((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
               ,in_stack_ffffffffffffff54);
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    length((QTextBlock *)in_stack_ffffffffffffff48);
    QTextDocumentPrivate::find
              ((QTextDocumentPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff54);
    while (bVar1 = QFragmentMap<QTextFragmentData>::ConstIterator::operator!=
                             ((ConstIterator *)local_28,(ConstIterator *)local_38), bVar1) {
      pQVar3 = QFragmentMap<QTextFragmentData>::ConstIterator::value((ConstIterator *)0x88d739);
      local_78 = QString::constData((QString *)0x88d748);
      local_78 = local_78 + pQVar3->stringPosition;
      pQVar4 = local_78 + (pQVar3->super_QFragment<1>).size_array[0];
      for (; local_78 < pQVar4; local_78 = local_78 + 1) {
        high = QChar::unicode(local_78);
        local_84 = (wchar32)(ushort)high;
        bVar1 = QChar::isHighSurrogate(local_84);
        if ((bVar1) && (local_78 + 1 < pQVar4)) {
          low_00 = QChar::unicode(local_78 + 1);
          bVar1 = QChar::isLowSurrogate((uint)(ushort)low_00);
          if (bVar1) {
            local_84 = QChar::surrogateToUcs4(high,low_00);
            local_78 = local_78 + 1;
          }
        }
        iVar2 = QChar::direction(local_84);
        if (iVar2 == 0) {
          local_54 = LeftToRight;
          goto LAB_0088d884;
        }
        if ((iVar2 == 1) || (iVar2 == 0xd)) {
          local_54 = RightToLeft;
          goto LAB_0088d884;
        }
      }
      QFragmentMap<QTextFragmentData>::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    local_54 = LeftToRight;
LAB_0088d884:
    QString::~QString((QString *)0x88d88e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

Qt::LayoutDirection QTextBlock::textDirection() const
{
    Qt::LayoutDirection dir = blockFormat().layoutDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    dir = p->defaultTextOption.textDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    const QString buffer = p->buffer();

    const int pos = position();
    QTextDocumentPrivate::FragmentIterator it = p->find(pos);
    QTextDocumentPrivate::FragmentIterator end = p->find(pos + length() - 1); // -1 to omit the block separator char
    for (; it != end; ++it) {
        const QTextFragmentData * const frag = it.value();
        const QChar *p = buffer.constData() + frag->stringPosition;
        const QChar * const end = p + frag->size_array[0];
        while (p < end) {
            uint ucs4 = p->unicode();
            if (QChar::isHighSurrogate(ucs4) && p + 1 < end) {
                ushort low = p[1].unicode();
                if (QChar::isLowSurrogate(low)) {
                    ucs4 = QChar::surrogateToUcs4(ucs4, low);
                    ++p;
                }
            }
            switch (QChar::direction(ucs4)) {
            case QChar::DirL:
                return Qt::LeftToRight;
            case QChar::DirR:
            case QChar::DirAL:
                return Qt::RightToLeft;
            default:
                break;
            }
            ++p;
        }
    }
    return Qt::LeftToRight;
}